

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * extraZddSymmPairsCompute(DdManager *dd,DdNode *bFunc,DdNode *bVars)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *local_a8;
  DdNode *bVarsK_1;
  int i_1;
  int nVars_1;
  DdNode *bVarsExtra;
  int LevelF;
  int nVarsExtra;
  DdNode *bVarsNew;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *zSymmVars;
  DdNode *zPlus;
  DdNode *zTemp;
  DdNode *zRes1;
  DdNode *zRes0;
  DdNode *bVarsK;
  int i;
  int nVars;
  DdNode *bFR;
  DdNode *zRes;
  DdNode *bVars_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  pDVar2 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  if (pDVar2->index == 0x7fffffff) {
    iVar1 = Extra_bddSuppSize(dd,bVars);
    if (iVar1 < 2) {
      dd_local = (DdManager *)dd->zero;
    }
    else {
      zRes0 = bVars;
      for (bVarsK._0_4_ = 0; (int)bVarsK < iVar1 + -2; bVarsK._0_4_ = (int)bVarsK + 1) {
        zRes0 = (zRes0->type).kids.T;
      }
      dd_local = (DdManager *)extraZddTuplesFromBdd(dd,zRes0,bVars);
    }
  }
  else {
    if (bVars == dd->one) {
      __assert_fail("bVars != b1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddSymm.c"
                    ,0x25f,"DdNode *extraZddSymmPairsCompute(DdManager *, DdNode *, DdNode *)");
    }
    dd_local = (DdManager *)cuddCacheLookup2Zdd(dd,extraZddSymmPairsCompute,bFunc,bVars);
    if (dd_local == (DdManager *)0x0) {
      bVarsExtra._4_4_ = 0;
      _LevelF = bVars;
      while (dd->perm[_LevelF->index] < dd->perm[pDVar2->index]) {
        bVarsExtra._4_4_ = bVarsExtra._4_4_ + 1;
        _LevelF = (_LevelF->type).kids.T;
      }
      if (pDVar2->index != _LevelF->index) {
        __assert_fail("bFR->index == bVarsNew->index",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddSymm.c"
                      ,0x274,"DdNode *extraZddSymmPairsCompute(DdManager *, DdNode *, DdNode *)");
      }
      if (pDVar2 == bFunc) {
        bF1 = (pDVar2->type).kids.E;
        bVarsNew = (pDVar2->type).kids.T;
      }
      else {
        bF1 = (DdNode *)((ulong)(pDVar2->type).kids.E ^ 1);
        bVarsNew = (DdNode *)((ulong)(pDVar2->type).kids.T ^ 1);
      }
      bFR = extraZddSymmPairsCompute(dd,bF1,(_LevelF->type).kids.T);
      if (bFR == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + 1;
        if (bFR != dd->zero) {
          pDVar4 = extraZddSymmPairsCompute(dd,bVarsNew,(_LevelF->type).kids.T);
          if (pDVar4 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
          pDVar3 = cuddZddIntersect(dd,bFR,pDVar4);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            Cudd_RecursiveDerefZdd(dd,pDVar4);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,bFR);
          Cudd_RecursiveDerefZdd(dd,pDVar4);
          bFR = pDVar3;
        }
        pDVar4 = extraZddGetSymmetricVars(dd,bVarsNew,bF1,(_LevelF->type).kids.T);
        if (pDVar4 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,bFR);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
          if (pDVar4 == dd->zero) {
            Cudd_RecursiveDerefZdd(dd,pDVar4);
          }
          else {
            pDVar2 = cuddZddGetNode(dd,pDVar2->index << 1,pDVar4,dd->zero);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd(dd,bFR);
              Cudd_RecursiveDerefZdd(dd,pDVar4);
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
            *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + -1;
            pDVar4 = cuddZddUnion(dd,bFR,pDVar2);
            if (pDVar4 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd(dd,bFR);
              Cudd_RecursiveDerefZdd(dd,pDVar2);
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDerefZdd(dd,bFR);
            Cudd_RecursiveDerefZdd(dd,pDVar2);
            bFR = pDVar4;
          }
          if (bVarsExtra._4_4_ != 0) {
            pDVar2 = extraBddReduceVarSet(dd,bVars,bFunc);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd(dd,bFR);
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
            iVar1 = Extra_bddSuppSize(dd,pDVar2);
            if (iVar1 < 2) {
              Cudd_RecursiveDeref(dd,pDVar2);
            }
            else {
              local_a8 = pDVar2;
              for (bVarsK_1._0_4_ = 0; (int)bVarsK_1 < iVar1 + -2;
                  bVarsK_1._0_4_ = (int)bVarsK_1 + 1) {
                local_a8 = (local_a8->type).kids.T;
              }
              pDVar4 = extraZddTuplesFromBdd(dd,local_a8,pDVar2);
              if (pDVar4 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,pDVar2);
                Cudd_RecursiveDerefZdd(dd,bFR);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref(dd,pDVar2);
              pDVar2 = cuddZddUnion(dd,bFR,pDVar4);
              if (pDVar2 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd(dd,bFR);
                Cudd_RecursiveDerefZdd(dd,pDVar4);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDerefZdd(dd,bFR);
              Cudd_RecursiveDerefZdd(dd,pDVar4);
              bFR = pDVar2;
            }
          }
          *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + -1;
          cuddCacheInsert2(dd,extraZddSymmPairsCompute,bFunc,bVars,bFR);
          dd_local = (DdManager *)bFR;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * 
extraZddSymmPairsCompute( 
  DdManager * dd,   /* the manager */
  DdNode * bFunc,   /* the function whose symmetries are computed */
  DdNode * bVars )  /* the set of variables on which this function depends */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bFunc); 

    if ( cuddIsConstant(bFR) )
    {
        int nVars, i;

        // determine how many vars are in the bVars
        nVars = Extra_bddSuppSize( dd, bVars );
        if ( nVars < 2 )
            return z0;
        else
        {
            DdNode * bVarsK;

            // create the BDD bVarsK corresponding to K = 2;
            bVarsK = bVars;
            for ( i = 0; i < nVars-2; i++ )
                bVarsK = cuddT( bVarsK );
            return extraZddTuplesFromBdd( dd, bVarsK, bVars );
        }
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookup2Zdd(dd, extraZddSymmPairsCompute, bFunc, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;
        DdNode * zTemp, * zPlus, * zSymmVars;             
        DdNode * bF0, * bF1;             
        DdNode * bVarsNew;
        int nVarsExtra;
        int LevelF;

        // every variable in bF should be also in bVars, therefore LevelF cannot be above LevelV
        // if LevelF is below LevelV, scroll through the vars in bVars to the same level as F
        // count how many extra vars are there in bVars
        nVarsExtra = 0;
        LevelF = dd->perm[bFR->index];
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
            nVarsExtra++; 
        // the indexes (level) of variables should be synchronized now
        assert( bFR->index == bVarsNew->index );

        // cofactor the function
        if ( bFR != bFunc ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        // solve subproblems
        zRes0 = extraZddSymmPairsCompute( dd, bF0, cuddT(bVarsNew) );
        if ( zRes0 == NULL )
            return NULL;
        cuddRef( zRes0 );

        // if there is no symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddSymmPairsCompute( dd, bF1, cuddT(bVarsNew) );
            if ( zRes1 == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables are pair-wise symmetric 
            // that are pair-wise symmetric in both cofactors
            // therefore, intersect the solutions
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // consider the current top-most variable and find all the vars
        // that are pairwise symmetric with it
        // these variables are returned as a set of ZDD singletons
        zSymmVars = extraZddGetSymmetricVars( dd, bF1, bF0, cuddT(bVarsNew) );
        if ( zSymmVars == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zSymmVars );

        // attach the topmost variable to the set, to get the variable pairs
        // use the positive polarity ZDD variable for the purpose

        // there is no need to do so, if zSymmVars is empty
        if ( zSymmVars == z0 )
            Cudd_RecursiveDerefZdd( dd, zSymmVars );
        else
        {
            zPlus = cuddZddGetNode( dd, 2*bFR->index, zSymmVars, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                Cudd_RecursiveDerefZdd( dd, zSymmVars );
                return NULL;
            }
            cuddRef( zPlus );
            cuddDeref( zSymmVars );

            // add these variable pairs to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }

        // only zRes is referenced at this point

        // if we skipped some variables, these variables cannot be symmetric with
        // any variables that are currently in the support of bF, but they can be 
        // symmetric with the variables that are in bVars but not in the support of bF
        if ( nVarsExtra )
        {
            // it is possible to improve this step:
            // (1) there is no need to enter here, if nVarsExtra < 2

            // create the set of topmost nVarsExtra in bVars
            DdNode * bVarsExtra;
            int nVars;

            // remove from bVars all the variable that are in the support of bFunc
            bVarsExtra = extraBddReduceVarSet( dd, bVars, bFunc );  
            if ( bVarsExtra == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( bVarsExtra );

            // determine how many vars are in the bVarsExtra
            nVars = Extra_bddSuppSize( dd, bVarsExtra );
            if ( nVars < 2 )
            {
                Cudd_RecursiveDeref( dd, bVarsExtra );
            }
            else
            {
                int i;
                DdNode * bVarsK;

                // create the BDD bVarsK corresponding to K = 2;
                bVarsK = bVarsExtra;
                for ( i = 0; i < nVars-2; i++ )
                    bVarsK = cuddT( bVarsK );

                // create the 2 variable tuples
                zPlus = extraZddTuplesFromBdd( dd, bVarsK, bVarsExtra );
                if ( zPlus == NULL )
                {
                    Cudd_RecursiveDeref( dd, bVarsExtra );
                    Cudd_RecursiveDerefZdd( dd, zRes );
                    return NULL;
                }
                cuddRef( zPlus );
                Cudd_RecursiveDeref( dd, bVarsExtra );

                // add these to the result
                zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
                if ( zRes == NULL )
                {
                    Cudd_RecursiveDerefZdd( dd, zTemp );
                    Cudd_RecursiveDerefZdd( dd, zPlus );
                    return NULL;
                }
                cuddRef( zRes );
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
            }
        }
        cuddDeref( zRes );


        /* insert the result into cache */
        cuddCacheInsert2(dd, extraZddSymmPairsCompute, bFunc, bVars, zRes);
        return zRes;
    }
}